

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

cmJSONHelper<bool> *
cmJSONHelperBuilder::Bool
          (cmJSONHelper<bool> *__return_storage_ptr__,ErrorGenerator *error,bool defval)

{
  _Any_data local_40;
  _Manager_type local_30;
  bool local_20;
  
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_40,error);
  local_20 = defval;
  std::function<bool(bool&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Bool(std::function<void(Json::Value_const*,cmJSONState*)>const&,bool)::_lambda(bool&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(bool&,Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             (anon_class_40_2_ce0a3bf5 *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<bool> Bool(
    const JsonErrors::ErrorGenerator& error = JsonErrors::INVALID_BOOL,
    bool defval = false)
  {
    return [error, defval](bool& out, const Json::Value* value,
                           cmJSONState* state) -> bool {
      if (!value) {
        out = defval;
        return true;
      }
      if (!value->isBool()) {
        error(value, state);
        ;
        return false;
      }
      out = value->asBool();
      return true;
    };
  }